

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

void curses_update_status_silent(nh_player_info *pi)

{
  wchar_t wVar1;
  
  if (pi != (nh_player_info *)0x0) {
    memcpy(&player,pi,0x2dc);
    if (statdiff_moves == L'\xffffffff') {
      memcpy(&saved_player,pi,0x2dc);
      statdiff_moves = L'\0';
    }
    wVar1 = pi->moves;
    if (statdiff_moves != wVar1) {
      memcpy(&old_player,&saved_player,0x2dc);
      statdiff_moves = wVar1;
    }
    if (statdiff_moves % 100 == 1) {
      clearok(basewin,1);
      return;
    }
  }
  return;
}

Assistant:

void curses_update_status_silent(struct nh_player_info *pi)
{
    if (!pi)
	return;

    player = *pi;

    if (statdiff_moves == -1) {
	saved_player = player;
	statdiff_moves = 0;
    }

    if (statdiff_moves != pi->moves) {
	old_player = saved_player;
	statdiff_moves = pi->moves;
    }

    /* Flag Curses to clear and redraw the screen every so often, so
     * dgamelaunch won't need to replay the entire ttyrec when wants to
     * spectate a game. */
    if (statdiff_moves % 100 == 1)
	clearok(basewin, TRUE);
}